

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libregexp.c
# Opt level: O2

int get_class_atom(REParseState *s,CharRange *cr,uint8_t **pp,BOOL inclass)

{
  byte *pbVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  ushort *puVar5;
  REParseState *pRVar6;
  BOOL BVar7;
  int iVar8;
  uint uVar9;
  void *pvVar10;
  byte **ppbVar11;
  byte bVar12;
  char *fmt;
  byte *pbVar13;
  ulong uVar14;
  long lVar15;
  byte *local_c8;
  REParseState *local_c0;
  char name [64];
  byte local_78 [72];
  
  ppbVar11 = &local_c8;
  pbVar13 = *pp;
  bVar12 = *pbVar13;
  if (bVar12 == 0) {
    if (s->buf_end <= pbVar13) {
LAB_0016068b:
      fmt = "unexpected end";
      local_c8 = pbVar13;
      goto LAB_00160695;
    }
    bVar12 = 0;
LAB_00160869:
    uVar9 = (uint)bVar12;
    local_c8 = pbVar13 + 1;
    goto LAB_00160874;
  }
  local_c8 = pbVar13;
  if (bVar12 != 0x5c) goto LAB_00160864;
  local_c8 = pbVar13 + 1;
  if (s->buf_end <= local_c8) goto LAB_0016068b;
  pbVar1 = pbVar13 + 2;
  bVar12 = pbVar13[1];
  if (bVar12 == 0x44) {
    uVar9 = 1;
  }
  else {
    if (bVar12 == 0x50) {
LAB_001606a5:
      if (s->is_utf16 == 0) {
        BVar7 = 0;
LAB_001607ca:
        uVar9 = lre_parse_escape(&local_c8,BVar7 * 2);
        pbVar13 = local_c8;
        if (-1 < (int)uVar9) goto LAB_00160874;
        if ((uVar9 == 0xfffffffe) && (*local_c8 != 0)) {
          pvVar10 = memchr("^$\\.*+?()[]{}|/",(uint)*local_c8,0x10);
          if ((BVar7 != 0) && (pbVar1 = local_c8, pvVar10 == (void *)0x0)) {
LAB_001608f9:
            local_c8 = pbVar1;
            fmt = "invalid escape sequence in regular expression";
            s = s;
            goto LAB_00160695;
          }
        }
        else {
          pbVar1 = local_c8;
          if (BVar7 != 0) goto LAB_001608f9;
        }
LAB_00160864:
        if ((char)bVar12 < '\0') {
          uVar9 = unicode_from_utf8(pbVar13,6,&local_c8);
          if ((uVar9 < 0x10000) || (s->is_utf16 != 0)) goto LAB_00160874;
          fmt = "malformed unicode char";
          s = s;
          goto LAB_00160695;
        }
        goto LAB_00160869;
      }
      if (*pbVar1 != 0x7b) {
        fmt = "expecting \'{\' after \\p";
        local_c8 = pbVar1;
        goto LAB_00160695;
      }
      pbVar13 = pbVar13 + 3;
      uVar14 = 0;
      local_c8 = pbVar1;
      local_c0 = s;
      while( true ) {
        bVar2 = *pbVar13;
        BVar7 = is_unicode_char((uint)bVar2);
        if (BVar7 == 0) break;
        if (0x3e < uVar14) goto LAB_001609d4;
        name[uVar14] = bVar2;
        pbVar13 = pbVar13 + 1;
        uVar14 = uVar14 + 1;
      }
      name[uVar14] = '\0';
      if (bVar2 == 0x3d) {
        uVar14 = 0;
        while( true ) {
          pbVar13 = pbVar13 + 1;
          bVar2 = *pbVar13;
          BVar7 = is_unicode_char((uint)bVar2);
          if (BVar7 == 0) break;
          if (0x3e < uVar14) {
            fmt = "unknown unicode property value";
            s = local_c0;
            goto LAB_00160695;
          }
          local_78[uVar14] = bVar2;
          uVar14 = uVar14 + 1;
        }
        ppbVar11 = (byte **)((long)&local_c8 + uVar14);
      }
      pRVar6 = local_c0;
      *(undefined1 *)((long)ppbVar11 + 0x50) = 0;
      if (*pbVar13 != 0x7d) {
        fmt = "expecting \'}\'";
        s = local_c0;
        goto LAB_00160695;
      }
      iVar8 = bcmp(name,"Script",7);
      BVar7 = 0;
      if ((iVar8 == 0) || (iVar8 = bcmp(name,"sc",3), iVar8 == 0)) {
LAB_001609f1:
        cr_init(cr,pRVar6->opaque,lre_realloc);
        iVar8 = unicode_script(cr,(char *)local_78,BVar7);
        if (iVar8 != 0) {
          cr_free(cr);
          if (iVar8 != -2) {
LAB_00160ae2:
            re_parse_out_of_memory(local_c0);
            return -1;
          }
          fmt = "unknown unicode script";
          s = local_c0;
LAB_00160695:
          re_parse_error(s,fmt);
          return -1;
        }
      }
      else {
        iVar8 = bcmp(name,"Script_Extensions",0x12);
        BVar7 = 1;
        if ((iVar8 == 0) || (name._0_4_ == 0x786373)) goto LAB_001609f1;
        iVar8 = bcmp(name,"General_Category",0x11);
        if ((iVar8 != 0) && (iVar8 = bcmp(name,"gc",3), iVar8 != 0)) {
          if (local_78[0] == 0) {
            cr_init(cr,local_c0->opaque,lre_realloc);
            iVar8 = unicode_general_category(cr,name);
            if (iVar8 == -1) {
              cr_free(cr);
              goto LAB_00160ae2;
            }
            if ((-1 < iVar8) || (iVar8 = unicode_prop(cr,name), iVar8 == 0)) goto LAB_00160ab2;
            cr_free(cr);
            if (iVar8 != -2) goto LAB_00160ae2;
          }
LAB_001609d4:
          fmt = "unknown unicode property name";
          s = local_c0;
          goto LAB_00160695;
        }
        cr_init(cr,pRVar6->opaque,lre_realloc);
        iVar8 = unicode_general_category(cr,(char *)local_78);
        if (iVar8 != 0) {
          cr_free(cr);
          if (iVar8 == -2) {
            fmt = "unknown unicode general category";
            s = local_c0;
            goto LAB_00160695;
          }
          goto LAB_00160ae2;
        }
      }
LAB_00160ab2:
      if ((bVar12 != 0x50) || (iVar8 = cr_invert(cr), iVar8 == 0)) {
        local_c8 = pbVar13 + 1;
        uVar9 = 0x40000000;
        goto LAB_00160874;
      }
      goto LAB_001607b4;
    }
    if (bVar12 == 0x53) {
      uVar9 = 3;
    }
    else if (bVar12 == 0x57) {
      uVar9 = 5;
    }
    else {
      if (bVar12 == 99) {
        bVar12 = *pbVar1;
        if ((byte)((bVar12 & 0xdf) + 0xbf) < 0x1a) {
LAB_0016070f:
          uVar9 = bVar12 & 0x1f;
          local_c8 = pbVar13 + 3;
          goto LAB_00160874;
        }
        if ((inclass == 0) || (bVar12 != 0x5f && 9 < (byte)(bVar12 - 0x30))) {
          if (s->is_utf16 == 0) {
            uVar9 = 0x5c;
            goto LAB_00160874;
          }
        }
        else if (s->is_utf16 == 0) goto LAB_0016070f;
        goto LAB_001608f9;
      }
      if (bVar12 == 100) {
        uVar9 = 0;
      }
      else {
        if (bVar12 == 0x70) goto LAB_001606a5;
        if (bVar12 == 0x73) {
          uVar9 = 2;
        }
        else {
          if (bVar12 != 0x77) {
            BVar7 = s->is_utf16;
            goto LAB_001607ca;
          }
          uVar9 = 4;
        }
      }
    }
  }
  local_c0 = (REParseState *)CONCAT44(local_c0._4_4_,uVar9);
  puVar5 = *(ushort **)((long)char_range_table + (ulong)(uVar9 & 0xfffffffe) * 4);
  uVar3 = *puVar5;
  local_c8 = pbVar1;
  cr_init(cr,s->opaque,lre_realloc);
  for (lVar15 = 0; (ulong)uVar3 * 4 != lVar15; lVar15 = lVar15 + 2) {
    uVar4 = *(ushort *)((long)puVar5 + lVar15 + 2);
    iVar8 = cr->len;
    if (cr->size <= iVar8) {
      iVar8 = cr_realloc(cr,iVar8 + 1);
      if (iVar8 != 0) goto LAB_001607b4;
      iVar8 = cr->len;
    }
    cr->len = iVar8 + 1;
    cr->points[iVar8] = (uint)uVar4;
  }
  uVar9 = 0x40000000;
  if ((((ulong)local_c0 & 1) == 0) || (iVar8 = cr_invert(cr), iVar8 == 0)) {
LAB_00160874:
    *pp = local_c8;
    return uVar9;
  }
LAB_001607b4:
  cr_free(cr);
  return -1;
}

Assistant:

static int get_class_atom(REParseState *s, CharRange *cr,
                          const uint8_t **pp, BOOL inclass)
{
    const uint8_t *p;
    uint32_t c;
    int ret;
    
    p = *pp;

    c = *p;
    switch(c) {
    case '\\':
        p++;
        if (p >= s->buf_end)
            goto unexpected_end;
        c = *p++;
        switch(c) {
        case 'd':
            c = CHAR_RANGE_d;
            goto class_range;
        case 'D':
            c = CHAR_RANGE_D;
            goto class_range;
        case 's':
            c = CHAR_RANGE_s;
            goto class_range;
        case 'S':
            c = CHAR_RANGE_S;
            goto class_range;
        case 'w':
            c = CHAR_RANGE_w;
            goto class_range;
        case 'W':
            c = CHAR_RANGE_W;
        class_range:
            if (cr_init_char_range(s, cr, c))
                return -1;
            c = CLASS_RANGE_BASE;
            break;
        case 'c':
            c = *p;
            if ((c >= 'a' && c <= 'z') ||
                (c >= 'A' && c <= 'Z') ||
                (((c >= '0' && c <= '9') || c == '_') &&
                 inclass && !s->is_utf16)) {   /* Annex B.1.4 */
                c &= 0x1f;
                p++;
            } else if (s->is_utf16) {
                goto invalid_escape;
            } else {
                /* otherwise return '\' and 'c' */
                p--;
                c = '\\';
            }
            break;
#ifdef CONFIG_ALL_UNICODE
        case 'p':
        case 'P':
            if (s->is_utf16) {
                if (parse_unicode_property(s, cr, &p, (c == 'P')))
                    return -1;
                c = CLASS_RANGE_BASE;
                break;
            }
            /* fall thru */
#endif
        default:
            p--;
            ret = lre_parse_escape(&p, s->is_utf16 * 2);
            if (ret >= 0) {
                c = ret;
            } else {
                if (ret == -2 && *p != '\0' && strchr("^$\\.*+?()[]{}|/", *p)) {
                    /* always valid to escape these characters */
                    goto normal_char;
                } else if (s->is_utf16) {
                invalid_escape:
                    return re_parse_error(s, "invalid escape sequence in regular expression");
                } else {
                    /* just ignore the '\' */
                    goto normal_char;
                }
            }
            break;
        }
        break;
    case '\0':
        if (p >= s->buf_end) {
        unexpected_end:
            return re_parse_error(s, "unexpected end");
        }
        /* fall thru */
    default:
    normal_char:
        /* normal char */
        if (c >= 128) {
            c = unicode_from_utf8(p, UTF8_CHAR_LEN_MAX, &p);
            if ((unsigned)c > 0xffff && !s->is_utf16) {
                /* XXX: should handle non BMP-1 code points */
                return re_parse_error(s, "malformed unicode char");
            }
        } else {
            p++;
        }
        break;
    }
    *pp = p;
    return c;
}